

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXImporter.cpp
# Opt level: O1

void __thiscall Assimp::FBXImporter::SetupProperties(FBXImporter *this,Importer *pImp)

{
  int iVar1;
  
  iVar1 = Importer::GetPropertyInteger(pImp,"IMPORT_FBX_READ_ALL_GEOMETRY_LAYERS",1);
  (this->settings).readAllLayers = iVar1 != 0;
  iVar1 = Importer::GetPropertyInteger(pImp,"IMPORT_FBX_READ_ALL_MATERIALS",0);
  (this->settings).readAllMaterials = iVar1 != 0;
  iVar1 = Importer::GetPropertyInteger(pImp,"IMPORT_FBX_READ_MATERIALS",1);
  (this->settings).readMaterials = iVar1 != 0;
  iVar1 = Importer::GetPropertyInteger(pImp,"IMPORT_FBX_READ_TEXTURES",1);
  (this->settings).readTextures = iVar1 != 0;
  iVar1 = Importer::GetPropertyInteger(pImp,"IMPORT_FBX_READ_CAMERAS",1);
  (this->settings).readCameras = iVar1 != 0;
  iVar1 = Importer::GetPropertyInteger(pImp,"IMPORT_FBX_READ_LIGHTS",1);
  (this->settings).readLights = iVar1 != 0;
  iVar1 = Importer::GetPropertyInteger(pImp,"IMPORT_FBX_READ_ANIMATIONS",1);
  (this->settings).readAnimations = iVar1 != 0;
  iVar1 = Importer::GetPropertyInteger(pImp,"IMPORT_FBX_STRICT_MODE",0);
  (this->settings).strictMode = iVar1 != 0;
  iVar1 = Importer::GetPropertyInteger(pImp,"IMPORT_FBX_PRESERVE_PIVOTS",1);
  (this->settings).preservePivots = iVar1 != 0;
  iVar1 = Importer::GetPropertyInteger(pImp,"IMPORT_FBX_OPTIMIZE_EMPTY_ANIMATION_CURVES",1);
  (this->settings).optimizeEmptyAnimationCurves = iVar1 != 0;
  iVar1 = Importer::GetPropertyInteger
                    (pImp,"AI_CONFIG_IMPORT_FBX_EMBEDDED_TEXTURES_LEGACY_NAMING",0);
  (this->settings).useLegacyEmbeddedTextureNaming = iVar1 != 0;
  iVar1 = Importer::GetPropertyInteger(pImp,"AI_CONFIG_IMPORT_REMOVE_EMPTY_BONES",1);
  (this->settings).removeEmptyBones = iVar1 != 0;
  iVar1 = Importer::GetPropertyInteger(pImp,"AI_CONFIG_FBX_CONVERT_TO_M",0);
  (this->settings).convertToMeters = iVar1 != 0;
  return;
}

Assistant:

void FBXImporter::SetupProperties(const Importer *pImp) {
	settings.readAllLayers = pImp->GetPropertyBool(AI_CONFIG_IMPORT_FBX_READ_ALL_GEOMETRY_LAYERS, true);
	settings.readAllMaterials = pImp->GetPropertyBool(AI_CONFIG_IMPORT_FBX_READ_ALL_MATERIALS, false);
	settings.readMaterials = pImp->GetPropertyBool(AI_CONFIG_IMPORT_FBX_READ_MATERIALS, true);
	settings.readTextures = pImp->GetPropertyBool(AI_CONFIG_IMPORT_FBX_READ_TEXTURES, true);
	settings.readCameras = pImp->GetPropertyBool(AI_CONFIG_IMPORT_FBX_READ_CAMERAS, true);
	settings.readLights = pImp->GetPropertyBool(AI_CONFIG_IMPORT_FBX_READ_LIGHTS, true);
	settings.readAnimations = pImp->GetPropertyBool(AI_CONFIG_IMPORT_FBX_READ_ANIMATIONS, true);
	settings.strictMode = pImp->GetPropertyBool(AI_CONFIG_IMPORT_FBX_STRICT_MODE, false);
	settings.preservePivots = pImp->GetPropertyBool(AI_CONFIG_IMPORT_FBX_PRESERVE_PIVOTS, true);
	settings.optimizeEmptyAnimationCurves = pImp->GetPropertyBool(AI_CONFIG_IMPORT_FBX_OPTIMIZE_EMPTY_ANIMATION_CURVES, true);
	settings.useLegacyEmbeddedTextureNaming = pImp->GetPropertyBool(AI_CONFIG_IMPORT_FBX_EMBEDDED_TEXTURES_LEGACY_NAMING, false);
	settings.removeEmptyBones = pImp->GetPropertyBool(AI_CONFIG_IMPORT_REMOVE_EMPTY_BONES, true);
	settings.convertToMeters = pImp->GetPropertyBool(AI_CONFIG_FBX_CONVERT_TO_M, false);
}